

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

void DoRemove(AActor *removetarget,int flags,PClassActor *filter,FName *species)

{
  bool bVar1;
  bool bVar2;
  FName local_24;
  
  bVar1 = DoCheckClass(removetarget,filter,SUB41((flags & 0x10U) >> 4,0));
  bVar2 = DoCheckSpecies(removetarget,&local_24,SUB41((flags & 0x20U) >> 5,0));
  if ((flags & 0x40U) == 0) {
    if (!bVar1 || !bVar2) {
      return;
    }
  }
  else if (!bVar1 && !bVar2) {
    return;
  }
  if ((flags & 8U) != 0) {
    P_RemoveThing(removetarget);
  }
  if (((flags & 4U) != 0) &&
     ((((removetarget->flags3).Value & 0x2000) == 0 ||
      (((removetarget->flags).Value & 0x10000) == 0)))) {
    P_RemoveThing(removetarget);
  }
  if (((flags & 2U) == 0) && (((removetarget->flags3).Value & 0x2000) != 0)) {
    P_RemoveThing(removetarget);
  }
  if (((flags & 1U) != 0) && (((removetarget->flags).Value & 0x10000) != 0)) {
    P_RemoveThing(removetarget);
    return;
  }
  return;
}

Assistant:

static void DoRemove(AActor *removetarget, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(removetarget, filter, !!(flags & RMVF_EXFILTER)),
		speciespass = DoCheckSpecies(removetarget, species, !!(flags & RMVF_EXSPECIES));
	if ((flags & RMVF_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		if ((flags & RMVF_EVERYTHING))
		{
			P_RemoveThing(removetarget);
		}
		if ((flags & RMVF_MISC) && !((removetarget->flags3 & MF3_ISMONSTER) && (removetarget->flags & MF_MISSILE)))
		{
			P_RemoveThing(removetarget);
		}
		if ((removetarget->flags3 & MF3_ISMONSTER) && !(flags & RMVF_NOMONSTERS))
		{
			P_RemoveThing(removetarget);
		}
		if ((removetarget->flags & MF_MISSILE) && (flags & RMVF_MISSILES))
		{
			P_RemoveThing(removetarget);
		}
	}
}